

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getEnterVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int leaveIdx,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterMax,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *leavebound,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  uint *puVar1;
  undefined8 uVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int iVar9;
  Status SVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  pointer pnVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  Status *pSVar14;
  undefined8 *puVar15;
  long lVar16;
  undefined8 uVar17;
  cpp_dec_float<50U,_int,_void> *pcVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId leftId;
  cpp_dec_float<50U,_int,_void> local_f8;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  DataKey local_38;
  
  lVar20 = (long)leaveIdx;
  local_38 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data[lVar20].super_DataKey;
  if (local_38.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_f8,(SPxId *)&local_38);
    iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_f8);
    lVar19 = (long)iVar9;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data[lVar19]) {
    case D_FREE:
      pnVar12 = (this->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = lVar20 * 0x38;
      local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
      local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
      local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
      local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_78.exp = pnVar12[lVar20].m_backend.exp;
      local_78.neg = pnVar12[lVar20].m_backend.neg;
      local_78.fpclass = pnVar12[lVar20].m_backend.fpclass;
      local_78.prec_elem = pnVar12[lVar20].m_backend.prec_elem;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 10;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems._24_5_ = 0;
      local_b8.data._M_elems[7]._1_3_ = 0;
      local_b8.data._M_elems._32_5_ = 0;
      local_b8.data._M_elems[9]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      if (&local_b8 == &enterMax->m_backend) {
        enterMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_78;
      }
      else {
        local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
        local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
        local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
        local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
        local_b8.prec_elem = local_78.prec_elem;
        local_b8.fpclass = local_78.fpclass;
        local_b8.data._M_elems._0_8_ = local_78.data._M_elems._0_8_;
        local_b8.data._M_elems._8_8_ = local_78.data._M_elems._8_8_;
        local_b8.data._M_elems._16_8_ = local_78.data._M_elems._16_8_;
        local_b8.exp = local_78.exp;
        local_b8.neg = local_78.neg;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_b8,&enterMax->m_backend);
      if (local_b8.fpclass == cpp_dec_float_NaN) {
LAB_00245ce7:
        lVar16 = 0xa28;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_f8,0,(type *)0x0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_b8,&local_f8);
        if (-1 < iVar9) goto LAB_00245ce7;
        lVar16 = 0xa10;
      }
      lVar16 = *(long *)((long)&(this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .
                                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._vptr_ClassArray + lVar16);
      uVar17 = *(undefined8 *)(lVar16 + 0x20 + lVar21);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar4 = *(undefined8 *)(lVar16 + lVar21);
      uVar5 = ((undefined8 *)(lVar16 + lVar21))[1];
      puVar15 = (undefined8 *)(lVar16 + 0x10 + lVar21);
      uVar6 = *puVar15;
      uVar7 = puVar15[1];
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar6;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar7;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar4;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar5;
      (leavebound->m_backend).exp = *(int *)(lVar16 + 0x28 + lVar21);
      (leavebound->m_backend).neg = *(bool *)(lVar16 + 0x2c + lVar21);
      uVar2 = *(undefined8 *)(lVar16 + 0x30 + lVar21);
      (leavebound->m_backend).fpclass = (int)uVar2;
      (leavebound->m_backend).prec_elem = (int)((ulong)uVar2 >> 0x20);
      pnVar12 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar6;
      *(undefined8 *)(puVar1 + 2) = uVar7;
      *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar4;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar5;
      pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
      pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
      iVar8 = (leavebound->m_backend).prec_elem;
      pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar12[lVar19].m_backend.prec_elem = iVar8;
      pnVar12 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) =
           *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
      uVar17 = *(undefined8 *)(leavebound->m_backend).data._M_elems;
      uVar2 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
      uVar4 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
      puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
      *(undefined8 *)(puVar1 + 2) = uVar4;
      *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar17;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar2;
      pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
      pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
      iVar8 = (leavebound->m_backend).prec_elem;
      pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar12[lVar19].m_backend.prec_elem = iVar8;
      pcVar11 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = &leavebound->m_backend;
      if ((&local_f8 != pcVar11) && (pcVar13 = pcVar11, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = (leavebound->m_backend).exp;
        local_f8.neg = (leavebound->m_backend).neg;
        local_f8.fpclass = (leavebound->m_backend).fpclass;
        local_f8.prec_elem = (leavebound->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
      pSVar14 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00245e24;
    case D_ON_UPPER:
      pnVar12 = (this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
      uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
      (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
      (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
      iVar8 = pnVar12[lVar20].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar8;
      pnVar12 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
      pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
      pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
      iVar8 = (leavebound->m_backend).prec_elem;
      pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar12[lVar19].m_backend.prec_elem = iVar8;
      pcVar11 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = &leavebound->m_backend;
      if ((&local_f8 != pcVar11) && (pcVar13 = pcVar11, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = (leavebound->m_backend).exp;
        local_f8.neg = (leavebound->m_backend).neg;
        local_f8.fpclass = (leavebound->m_backend).fpclass;
        local_f8.prec_elem = (leavebound->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
LAB_00245c7d:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
      pSVar14 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00245c89;
    case D_ON_LOWER:
      pnVar12 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
      uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
      (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
      (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
      iVar8 = pnVar12[lVar20].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar8;
      pnVar12 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
      pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
      pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
      iVar8 = (leavebound->m_backend).prec_elem;
      pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar12[lVar19].m_backend.prec_elem = iVar8;
      pcVar11 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = &leavebound->m_backend;
      if ((&local_f8 != pcVar11) && (pcVar13 = pcVar11, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = (leavebound->m_backend).exp;
        local_f8.neg = (leavebound->m_backend).neg;
        local_f8.fpclass = (leavebound->m_backend).fpclass;
        local_f8.prec_elem = (leavebound->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
      goto LAB_00245e87;
    case D_ON_BOTH:
      pnVar12 = (this->theFvec->thedelta).
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
      local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
      local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
      local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_78.exp = pnVar12[lVar20].m_backend.exp;
      local_78.neg = pnVar12[lVar20].m_backend.neg;
      local_78.fpclass = pnVar12[lVar20].m_backend.fpclass;
      local_78.prec_elem = pnVar12[lVar20].m_backend.prec_elem;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 10;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems._24_5_ = 0;
      local_b8.data._M_elems[7]._1_3_ = 0;
      local_b8.data._M_elems._32_5_ = 0;
      local_b8.data._M_elems[9]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      if (&local_b8 != &enterMax->m_backend) {
        uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 8);
        local_b8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_b8.data._M_elems._0_8_ = *(undefined8 *)(enterMax->m_backend).data._M_elems;
        local_b8.data._M_elems._8_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 2);
        local_b8.data._M_elems._16_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 6);
        local_b8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_b8.exp = (enterMax->m_backend).exp;
        local_b8.neg = (enterMax->m_backend).neg;
        local_b8.fpclass = (enterMax->m_backend).fpclass;
        local_b8.prec_elem = (enterMax->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_b8,&local_78);
      if (local_b8.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_f8,0,(type *)0x0);
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_b8,&local_f8);
        if (iVar9 < 0) {
          pnVar12 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
          uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
          uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
          puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
          uVar5 = *(undefined8 *)puVar1;
          uVar6 = *(undefined8 *)(puVar1 + 2);
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
          *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
          *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
          (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
          (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
          iVar8 = pnVar12[lVar20].m_backend.prec_elem;
          (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
          (leavebound->m_backend).prec_elem = iVar8;
          pnVar12 = (this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
          puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = uVar5;
          *(undefined8 *)(puVar1 + 2) = uVar6;
          *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
          *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
          pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
          pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
          iVar8 = (leavebound->m_backend).prec_elem;
          pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
          pnVar12[lVar19].m_backend.prec_elem = iVar8;
          pcVar11 = &(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
          local_f8.fpclass = cpp_dec_float_finite;
          local_f8.prec_elem = 10;
          local_f8.data._M_elems[0] = 0;
          local_f8.data._M_elems[1] = 0;
          local_f8.data._M_elems[2] = 0;
          local_f8.data._M_elems[3] = 0;
          local_f8.data._M_elems[4] = 0;
          local_f8.data._M_elems[5] = 0;
          local_f8.data._M_elems._24_5_ = 0;
          local_f8.data._M_elems[7]._1_3_ = 0;
          local_f8.data._M_elems._32_5_ = 0;
          local_f8.data._M_elems[9]._1_3_ = 0;
          local_f8.exp = 0;
          local_f8.neg = false;
          pcVar13 = &leavebound->m_backend;
          if ((&local_f8 != pcVar11) && (pcVar13 = pcVar11, &local_f8 != &leavebound->m_backend)) {
            uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
            local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
            local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
            local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
            local_f8.data._M_elems._8_8_ =
                 *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
            local_f8.data._M_elems._16_8_ =
                 *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
            uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
            local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
            local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
            local_f8.exp = (leavebound->m_backend).exp;
            local_f8.neg = (leavebound->m_backend).neg;
            local_f8.fpclass = (leavebound->m_backend).fpclass;
            local_f8.prec_elem = (leavebound->m_backend).prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_f8,pcVar13);
          goto LAB_00245c7d;
        }
      }
      pnVar12 = (this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
      uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
      uVar5 = *(undefined8 *)puVar1;
      uVar6 = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
      *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
      (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
      (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
      iVar8 = pnVar12[lVar20].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar8;
      pnVar12 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
      puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 2) = uVar6;
      *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
      *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
      pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
      pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
      iVar8 = (leavebound->m_backend).prec_elem;
      pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
      pnVar12[lVar19].m_backend.prec_elem = iVar8;
      pcVar11 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar20].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = &leavebound->m_backend;
      if ((&local_f8 != pcVar11) && (pcVar13 = pcVar11, &local_f8 != &leavebound->m_backend)) {
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(leavebound->m_backend).data._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((leavebound->m_backend).data._M_elems + 4);
        uVar17 = *(undefined8 *)((leavebound->m_backend).data._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = (leavebound->m_backend).exp;
        local_f8.neg = (leavebound->m_backend).neg;
        local_f8.fpclass = (leavebound->m_backend).fpclass;
        local_f8.prec_elem = (leavebound->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
LAB_00245e87:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
      pSVar14 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
LAB_00245e93:
      pSVar14[lVar19] = P_ON_UPPER;
      return;
    case D_UNDEFINED:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER06 This should never happen.","");
      *puVar15 = &PTR__SPxException_006a9ee8;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_FIXED:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER04 This should never happen.","");
      *puVar15 = &PTR__SPxException_006a9ee8;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER07 This should never happen.","");
      *puVar15 = &PTR__SPxException_006a9ee8;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      pnVar3 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar3[lVar20].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      pnVar12 = pnVar3 + lVar20;
      uVar23 = (pnVar12->m_backend).data._M_elems[0];
      uVar24 = *(uint *)((long)&(pnVar12->m_backend).data + 4);
      uVar25 = *(uint *)((long)&(pnVar12->m_backend).data + 8);
      uVar26 = *(uint *)((long)&(pnVar12->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar3[lVar20].m_backend.data + 0x10);
      uVar27 = *puVar1;
      uVar28 = puVar1[1];
      uVar29 = puVar1[2];
      uVar30 = puVar1[3];
      (leavebound->m_backend).data._M_elems[4] = uVar27;
      (leavebound->m_backend).data._M_elems[5] = uVar28;
      (leavebound->m_backend).data._M_elems[6] = uVar29;
      (leavebound->m_backend).data._M_elems[7] = uVar30;
      (leavebound->m_backend).data._M_elems[0] = uVar23;
      (leavebound->m_backend).data._M_elems[1] = uVar24;
      (leavebound->m_backend).data._M_elems[2] = uVar25;
      (leavebound->m_backend).data._M_elems[3] = uVar26;
      (leavebound->m_backend).exp = pnVar3[lVar20].m_backend.exp;
      (leavebound->m_backend).neg = pnVar3[lVar20].m_backend.neg;
      iVar8 = pnVar3[lVar20].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar3[lVar20].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar8;
      pnVar12 = (this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      pnVar3 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = *(undefined8 *)((long)&pnVar3[lVar20].m_backend.data + 0x20);
      *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
      pnVar12 = pnVar3 + lVar20;
      uVar23 = (pnVar12->m_backend).data._M_elems[0];
      uVar24 = *(uint *)((long)&(pnVar12->m_backend).data + 4);
      uVar25 = *(uint *)((long)&(pnVar12->m_backend).data + 8);
      uVar26 = *(uint *)((long)&(pnVar12->m_backend).data + 0xc);
      puVar1 = (uint *)((long)&pnVar3[lVar20].m_backend.data + 0x10);
      uVar27 = *puVar1;
      uVar28 = puVar1[1];
      uVar29 = puVar1[2];
      uVar30 = puVar1[3];
      (leavebound->m_backend).data._M_elems[4] = uVar27;
      (leavebound->m_backend).data._M_elems[5] = uVar28;
      (leavebound->m_backend).data._M_elems[6] = uVar29;
      (leavebound->m_backend).data._M_elems[7] = uVar30;
      (leavebound->m_backend).data._M_elems[0] = uVar23;
      (leavebound->m_backend).data._M_elems[1] = uVar24;
      (leavebound->m_backend).data._M_elems[2] = uVar25;
      (leavebound->m_backend).data._M_elems[3] = uVar26;
      (leavebound->m_backend).exp = pnVar3[lVar20].m_backend.exp;
      (leavebound->m_backend).neg = pnVar3[lVar20].m_backend.neg;
      iVar8 = pnVar3[lVar20].m_backend.prec_elem;
      (leavebound->m_backend).fpclass = pnVar3[lVar20].m_backend.fpclass;
      (leavebound->m_backend).prec_elem = iVar8;
      pnVar12 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XENTER05 This should never happen.","");
      *puVar15 = &PTR__SPxException_006a9ee8;
      puVar15[1] = puVar15 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar15 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
    *puVar1 = uVar27;
    puVar1[1] = uVar28;
    puVar1[2] = uVar29;
    puVar1[3] = uVar30;
    pnVar3 = pnVar12 + lVar19;
    (pnVar3->m_backend).data._M_elems[0] = uVar23;
    *(uint *)((long)&(pnVar3->m_backend).data + 4) = uVar24;
    *(uint *)((long)&(pnVar3->m_backend).data + 8) = uVar25;
    *(uint *)((long)&(pnVar3->m_backend).data + 0xc) = uVar26;
    pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
    pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
    iVar8 = (leavebound->m_backend).prec_elem;
    pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar12[lVar19].m_backend.prec_elem = iVar8;
    SVar10 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::dualRowStatus(&this->
                              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,iVar9);
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.rowstat.data[lVar19] = SVar10;
    if (SVar10 == D_ON_BOTH) {
      pcVar11 = &(this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
      pcVar18 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = pcVar11;
      if ((&local_f8 != pcVar18) && (pcVar13 = pcVar18, &local_f8 != pcVar11)) {
        uVar17 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar11->exp;
        local_f8.neg = pcVar11->neg;
        local_f8.fpclass = pcVar11->fpclass;
        local_f8.prec_elem = pcVar11->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
      pcVar11 = &(this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
      pcVar18 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = pcVar11;
      if ((&local_f8 != pcVar18) && (pcVar13 = pcVar18, &local_f8 != pcVar11)) {
        uVar17 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar11->exp;
        local_f8.neg = pcVar11->neg;
        local_f8.fpclass = pcVar11->fpclass;
        local_f8.prec_elem = pcVar11->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
    }
    else {
      if (SVar10 == D_ON_LOWER) {
        pnVar3 = (this->theLRbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if (SVar10 != D_ON_UPPER) {
          return;
        }
        pnVar3 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar18 = &pnVar12[lVar19].m_backend;
      pcVar11 = &pnVar3[lVar19].m_backend;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      pcVar13 = pcVar11;
      if ((&local_f8 != pcVar18) && (pcVar13 = pcVar18, &local_f8 != pcVar11)) {
        uVar17 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar11->exp;
        local_f8.neg = pcVar11->neg;
        local_f8.fpclass = pcVar11->fpclass;
        local_f8.prec_elem = pcVar11->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
    }
    goto LAB_00245f40;
  }
  SPxColId::SPxColId((SPxColId *)&local_f8,(SPxId *)&local_38);
  iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
          ::number(&(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set,(DataKey *)&local_f8);
  lVar19 = (long)iVar9;
  switch((this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thedesc.colstat.data[lVar19]) {
  case D_FREE:
    pnVar12 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar21 = lVar20 * 0x38;
    local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
    local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
    local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
    local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_78.exp = pnVar12[lVar20].m_backend.exp;
    local_78.neg = pnVar12[lVar20].m_backend.neg;
    local_78.fpclass = pnVar12[lVar20].m_backend.fpclass;
    local_78.prec_elem = pnVar12[lVar20].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    if (&local_b8 == &enterMax->m_backend) {
      enterMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_78;
    }
    else {
      local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
      local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
      local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
      local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
      local_b8.prec_elem = local_78.prec_elem;
      local_b8.fpclass = local_78.fpclass;
      local_b8.data._M_elems._0_8_ = local_78.data._M_elems._0_8_;
      local_b8.data._M_elems._8_8_ = local_78.data._M_elems._8_8_;
      local_b8.data._M_elems._16_8_ = local_78.data._M_elems._16_8_;
      local_b8.exp = local_78.exp;
      local_b8.neg = local_78.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_b8,&enterMax->m_backend);
    if (local_b8.fpclass == cpp_dec_float_NaN) {
LAB_00245a5b:
      lVar20 = 0xa10;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f8,0,(type *)0x0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_b8,&local_f8);
      lVar20 = 0xa28;
      if (iVar9 < 1) goto LAB_00245a5b;
    }
    lVar20 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar20);
    uVar17 = *(undefined8 *)(lVar20 + 0x20 + lVar21);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar4 = *(undefined8 *)(lVar20 + lVar21);
    uVar5 = ((undefined8 *)(lVar20 + lVar21))[1];
    puVar15 = (undefined8 *)(lVar20 + 0x10 + lVar21);
    uVar6 = *puVar15;
    uVar7 = puVar15[1];
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar6;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar5;
    (leavebound->m_backend).exp = *(int *)(lVar20 + 0x28 + lVar21);
    (leavebound->m_backend).neg = *(bool *)(lVar20 + 0x2c + lVar21);
    uVar2 = *(undefined8 *)(lVar20 + 0x30 + lVar21);
    (leavebound->m_backend).fpclass = (int)uVar2;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar2 >> 0x20);
    pnVar12 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar6;
    *(undefined8 *)(puVar1 + 2) = uVar7;
    *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar4;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar5;
    pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
    pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
    iVar8 = (leavebound->m_backend).prec_elem;
    pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar12[lVar19].m_backend.prec_elem = iVar8;
    pnVar3 = (this->theUCbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar3[lVar19].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar3[lVar19].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar6;
    *(undefined8 *)(puVar1 + 2) = uVar7;
    *(undefined8 *)&pnVar3[lVar19].m_backend.data = uVar4;
    *(undefined8 *)((long)&pnVar3[lVar19].m_backend.data + 8) = uVar5;
    pnVar3[lVar19].m_backend.exp = pnVar12[lVar19].m_backend.exp;
    pnVar3[lVar19].m_backend.neg = pnVar12[lVar19].m_backend.neg;
    iVar8 = pnVar12[lVar19].m_backend.prec_elem;
    pnVar3[lVar19].m_backend.fpclass = pnVar12[lVar19].m_backend.fpclass;
    pnVar3[lVar19].m_backend.prec_elem = iVar8;
    pcVar11 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    pcVar13 = pcVar11;
    if ((&local_f8 != &leavebound->m_backend) &&
       (pcVar13 = &leavebound->m_backend, &local_f8 != pcVar11)) {
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 8);
      local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems;
      local_f8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 2);
      local_f8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 4);
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 6);
      local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.exp = pcVar11->exp;
      local_f8.neg = pcVar11->neg;
      local_f8.fpclass = pcVar11->fpclass;
      local_f8.prec_elem = pcVar11->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_00245e24:
    pSVar14[lVar19] = P_FIXED;
    return;
  case D_ON_UPPER:
    pnVar12 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
    uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
    (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
    (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
    iVar8 = pnVar12[lVar20].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar8;
    pnVar12 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar5;
    *(undefined8 *)(puVar1 + 2) = uVar6;
    *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
    pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
    pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
    iVar8 = (leavebound->m_backend).prec_elem;
    pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar12[lVar19].m_backend.prec_elem = iVar8;
    goto LAB_00244dc1;
  case D_ON_LOWER:
    pnVar12 = (this->theUBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
    uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
    (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
    (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
    iVar8 = pnVar12[lVar20].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar8;
    pnVar12 = (this->theUCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar5;
    *(undefined8 *)(puVar1 + 2) = uVar6;
    *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
    pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
    pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
    iVar8 = (leavebound->m_backend).prec_elem;
    pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar12[lVar19].m_backend.prec_elem = iVar8;
    pcVar13 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
    if (&local_f8 == &leavebound->m_backend) {
LAB_002459c7:
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.neg = false;
      local_f8.exp = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      leavebound = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar13;
    }
    else {
      bVar22 = &local_f8 == pcVar13;
LAB_0024598d:
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.neg = false;
      local_f8.exp = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      if (!bVar22) {
        uVar17 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
        uVar17 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
        local_f8.exp = pcVar13->exp;
        local_f8.neg = pcVar13->neg;
        local_f8.fpclass = pcVar13->fpclass;
        local_f8.prec_elem = pcVar13->prec_elem;
      }
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_f8,&leavebound->m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
    goto LAB_00245e93;
  case D_ON_BOTH:
  case D_UNDEFINED:
    pnVar12 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
    local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
    local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
    local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_78.exp = pnVar12[lVar20].m_backend.exp;
    local_78.neg = pnVar12[lVar20].m_backend.neg;
    local_78.fpclass = pnVar12[lVar20].m_backend.fpclass;
    local_78.prec_elem = pnVar12[lVar20].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    if (&local_b8 != &enterMax->m_backend) {
      uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 8);
      local_b8.data._M_elems._32_5_ = SUB85(uVar17,0);
      local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_b8.data._M_elems._0_8_ = *(undefined8 *)(enterMax->m_backend).data._M_elems;
      local_b8.data._M_elems._8_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 2);
      local_b8.data._M_elems._16_8_ = *(undefined8 *)((enterMax->m_backend).data._M_elems + 4);
      uVar17 = *(undefined8 *)((enterMax->m_backend).data._M_elems + 6);
      local_b8.data._M_elems._24_5_ = SUB85(uVar17,0);
      local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_b8.exp = (enterMax->m_backend).exp;
      local_b8.neg = (enterMax->m_backend).neg;
      local_b8.fpclass = (enterMax->m_backend).fpclass;
      local_b8.prec_elem = (enterMax->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_b8,&local_78);
    if (local_b8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f8,0,(type *)0x0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_b8,&local_f8);
      if (iVar9 < 0) {
        pnVar12 = (this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
        uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
        uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
        uVar5 = *(undefined8 *)puVar1;
        uVar6 = *(undefined8 *)(puVar1 + 2);
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
        *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
        *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
        (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
        (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
        iVar8 = pnVar12[lVar20].m_backend.prec_elem;
        (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
        (leavebound->m_backend).prec_elem = iVar8;
        pnVar12 = (this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
        puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = uVar5;
        *(undefined8 *)(puVar1 + 2) = uVar6;
        *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
        *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
        pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
        pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
        iVar8 = (leavebound->m_backend).prec_elem;
        pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
        pnVar12[lVar19].m_backend.prec_elem = iVar8;
        pcVar13 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
        if (&local_f8 == &leavebound->m_backend) goto LAB_002459c7;
        bVar22 = &local_f8 == pcVar13;
        goto LAB_0024598d;
      }
    }
    pnVar12 = (this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar2 = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
    uVar4 = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
    uVar5 = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar5;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar6;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar2;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar4;
    (leavebound->m_backend).exp = pnVar12[lVar20].m_backend.exp;
    (leavebound->m_backend).neg = pnVar12[lVar20].m_backend.neg;
    iVar8 = pnVar12[lVar20].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar12[lVar20].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar8;
    pnVar12 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
    puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = uVar5;
    *(undefined8 *)(puVar1 + 2) = uVar6;
    *(undefined8 *)&pnVar12[lVar19].m_backend.data = uVar2;
    *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 8) = uVar4;
    pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
    pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
    iVar8 = (leavebound->m_backend).prec_elem;
    pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
    pnVar12[lVar19].m_backend.prec_elem = iVar8;
LAB_00244dc1:
    pcVar11 = &(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend;
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    pcVar13 = pcVar11;
    if ((&local_f8 != &leavebound->m_backend) &&
       (pcVar13 = &leavebound->m_backend, &local_f8 != pcVar11)) {
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 8);
      local_f8.data._M_elems._32_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.data._M_elems._0_8_ =
           *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems;
      local_f8.data._M_elems._8_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 2);
      local_f8.data._M_elems._16_8_ =
           *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 4);
      uVar17 = *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 6);
      local_f8.data._M_elems._24_5_ = SUB85(uVar17,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar17 >> 0x28);
      local_f8.exp = pcVar11->exp;
      local_f8.neg = pcVar11->neg;
      local_f8.fpclass = pcVar11->fpclass;
      local_f8.prec_elem = pcVar11->prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,pcVar13);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
    pSVar14 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data;
LAB_00245c89:
    pSVar14[lVar19] = P_ON_LOWER;
    return;
  case P_FIXED:
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"XENTER08 This should never happen.","");
    *puVar15 = &PTR__SPxException_006a9ee8;
    puVar15[1] = puVar15 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
               local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
    *puVar15 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  default:
    puVar15 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"XENTER09 This should never happen.","");
    *puVar15 = &PTR__SPxException_006a9ee8;
    puVar15[1] = puVar15 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar15 + 1),local_f8.data._M_elems._0_8_,
               local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
    *puVar15 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar15,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    pnVar3 = (this->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar3[lVar20].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    pnVar12 = pnVar3 + lVar20;
    uVar23 = (pnVar12->m_backend).data._M_elems[0];
    uVar24 = *(uint *)((long)&(pnVar12->m_backend).data + 4);
    uVar25 = *(uint *)((long)&(pnVar12->m_backend).data + 8);
    uVar26 = *(uint *)((long)&(pnVar12->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar3[lVar20].m_backend.data + 0x10);
    uVar27 = *puVar1;
    uVar28 = puVar1[1];
    uVar29 = puVar1[2];
    uVar30 = puVar1[3];
    (leavebound->m_backend).data._M_elems[4] = uVar27;
    (leavebound->m_backend).data._M_elems[5] = uVar28;
    (leavebound->m_backend).data._M_elems[6] = uVar29;
    (leavebound->m_backend).data._M_elems[7] = uVar30;
    (leavebound->m_backend).data._M_elems[0] = uVar23;
    (leavebound->m_backend).data._M_elems[1] = uVar24;
    (leavebound->m_backend).data._M_elems[2] = uVar25;
    (leavebound->m_backend).data._M_elems[3] = uVar26;
    (leavebound->m_backend).exp = pnVar3[lVar20].m_backend.exp;
    (leavebound->m_backend).neg = pnVar3[lVar20].m_backend.neg;
    iVar8 = pnVar3[lVar20].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar3[lVar20].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar8;
    pnVar12 = (this->theUCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_ON_UPPER:
    pnVar3 = (this->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = *(undefined8 *)((long)&pnVar3[lVar20].m_backend.data + 0x20);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    pnVar12 = pnVar3 + lVar20;
    uVar23 = (pnVar12->m_backend).data._M_elems[0];
    uVar24 = *(uint *)((long)&(pnVar12->m_backend).data + 4);
    uVar25 = *(uint *)((long)&(pnVar12->m_backend).data + 8);
    uVar26 = *(uint *)((long)&(pnVar12->m_backend).data + 0xc);
    puVar1 = (uint *)((long)&pnVar3[lVar20].m_backend.data + 0x10);
    uVar27 = *puVar1;
    uVar28 = puVar1[1];
    uVar29 = puVar1[2];
    uVar30 = puVar1[3];
    (leavebound->m_backend).data._M_elems[4] = uVar27;
    (leavebound->m_backend).data._M_elems[5] = uVar28;
    (leavebound->m_backend).data._M_elems[6] = uVar29;
    (leavebound->m_backend).data._M_elems[7] = uVar30;
    (leavebound->m_backend).data._M_elems[0] = uVar23;
    (leavebound->m_backend).data._M_elems[1] = uVar24;
    (leavebound->m_backend).data._M_elems[2] = uVar25;
    (leavebound->m_backend).data._M_elems[3] = uVar26;
    (leavebound->m_backend).exp = pnVar3[lVar20].m_backend.exp;
    (leavebound->m_backend).neg = pnVar3[lVar20].m_backend.neg;
    iVar8 = pnVar3[lVar20].m_backend.prec_elem;
    (leavebound->m_backend).fpclass = pnVar3[lVar20].m_backend.fpclass;
    (leavebound->m_backend).prec_elem = iVar8;
    pnVar12 = (this->theLCbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    break;
  case P_FREE:
    pnVar12 = (this->theFvec->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar21 = lVar20 * 0x38;
    local_78.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 0x20);
    local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[lVar20].m_backend.data;
    local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar12[lVar20].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar12[lVar20].m_backend.data + 0x10);
    local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_78.exp = pnVar12[lVar20].m_backend.exp;
    local_78.neg = pnVar12[lVar20].m_backend.neg;
    local_78.fpclass = pnVar12[lVar20].m_backend.fpclass;
    local_78.prec_elem = pnVar12[lVar20].m_backend.prec_elem;
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    if (&local_b8 == &enterMax->m_backend) {
      enterMax = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_78;
    }
    else {
      local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
      local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
      local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
      local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
      local_b8.prec_elem = local_78.prec_elem;
      local_b8.fpclass = local_78.fpclass;
      local_b8.data._M_elems._0_8_ = local_78.data._M_elems._0_8_;
      local_b8.data._M_elems._8_8_ = local_78.data._M_elems._8_8_;
      local_b8.data._M_elems._16_8_ = local_78.data._M_elems._16_8_;
      local_b8.exp = local_78.exp;
      local_b8.neg = local_78.neg;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_b8,&enterMax->m_backend);
    if (local_b8.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_f8,0,(type *)0x0);
      iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_b8,&local_f8);
      if (0 < iVar9) {
        lVar20 = 0x9f8;
        lVar16 = 0xa28;
        goto LAB_00245be3;
      }
    }
    lVar20 = 0x9e0;
    lVar16 = 0xa10;
LAB_00245be3:
    lVar16 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar16);
    uVar17 = *(undefined8 *)(lVar16 + 0x20 + lVar21);
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 8) = uVar17;
    uVar4 = *(undefined8 *)(lVar16 + lVar21);
    uVar5 = ((undefined8 *)(lVar16 + lVar21))[1];
    puVar15 = (undefined8 *)(lVar16 + 0x10 + lVar21);
    uVar6 = *puVar15;
    uVar7 = puVar15[1];
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 4) = uVar6;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 6) = uVar7;
    *(undefined8 *)(leavebound->m_backend).data._M_elems = uVar4;
    *(undefined8 *)((leavebound->m_backend).data._M_elems + 2) = uVar5;
    (leavebound->m_backend).exp = *(int *)(lVar16 + 0x28 + lVar21);
    (leavebound->m_backend).neg = *(bool *)(lVar16 + 0x2c + lVar21);
    uVar2 = *(undefined8 *)(lVar16 + 0x30 + lVar21);
    (leavebound->m_backend).fpclass = (int)uVar2;
    (leavebound->m_backend).prec_elem = (int)((ulong)uVar2 >> 0x20);
    lVar20 = *(long *)((long)&(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray + lVar20);
    lVar21 = lVar19 * 0x38;
    *(undefined8 *)(lVar20 + 0x20 + lVar21) = uVar17;
    puVar15 = (undefined8 *)(lVar20 + 0x10 + lVar21);
    *puVar15 = uVar6;
    puVar15[1] = uVar7;
    *(undefined8 *)(lVar20 + lVar21) = uVar4;
    ((undefined8 *)(lVar20 + lVar21))[1] = uVar5;
    *(int *)(lVar20 + 0x28 + lVar21) = (leavebound->m_backend).exp;
    *(bool *)(lVar20 + 0x2c + lVar21) = (leavebound->m_backend).neg;
    *(undefined8 *)(lVar20 + 0x30 + lVar21) = *(undefined8 *)&(leavebound->m_backend).fpclass;
    (this->
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thedesc.colstat.data[lVar19] = D_UNDEFINED;
    return;
  }
  *(undefined8 *)((long)&pnVar12[lVar19].m_backend.data + 0x20) = uVar17;
  puVar1 = (uint *)((long)&pnVar12[lVar19].m_backend.data + 0x10);
  *puVar1 = uVar27;
  puVar1[1] = uVar28;
  puVar1[2] = uVar29;
  puVar1[3] = uVar30;
  pnVar3 = pnVar12 + lVar19;
  (pnVar3->m_backend).data._M_elems[0] = uVar23;
  *(uint *)((long)&(pnVar3->m_backend).data + 4) = uVar24;
  *(uint *)((long)&(pnVar3->m_backend).data + 8) = uVar25;
  *(uint *)((long)&(pnVar3->m_backend).data + 0xc) = uVar26;
  pnVar12[lVar19].m_backend.exp = (leavebound->m_backend).exp;
  pnVar12[lVar19].m_backend.neg = (leavebound->m_backend).neg;
  iVar8 = (leavebound->m_backend).prec_elem;
  pnVar12[lVar19].m_backend.fpclass = (leavebound->m_backend).fpclass;
  pnVar12[lVar19].m_backend.prec_elem = iVar8;
  SVar10 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::dualColStatus(&this->
                            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,iVar9);
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thedesc.colstat.data[lVar19] = SVar10;
  if (SVar10 == D_ON_BOTH) {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_f8,
               &(this->theLCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_f8,
               &(this->theUCbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend,
               &(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar19].m_backend);
  }
  else {
    if (SVar10 == D_ON_LOWER) {
      pnVar3 = (this->theLCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (SVar10 != D_ON_UPPER) {
        return;
      }
      pnVar3 = (this->theUCbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_f8,&pnVar3[lVar19].m_backend,&pnVar12[lVar19].m_backend);
  }
LAB_00245f40:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            ((cpp_dec_float<50U,_int,_void> *)objChange,&local_f8);
  return;
}

Assistant:

void SPxSolverBase<R>::getEnterVals2
(
   int leaveIdx,
   R enterMax,
   R& leavebound,
   StableSum<R>& objChange
)
{
   int idx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   SPxId leftId = this->baseId(leaveIdx);

   if(leftId.isSPxRowId())
   {
      idx = this->number(SPxRowId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER04 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         switch(ds.rowStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theURbound[idx] * this->lhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theURbound[idx] * this->lhs(idx);
            objChange += theLRbound[idx] * this->rhs(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
#if 1
         throw SPxInternalCodeException("XENTER05 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "EENTER98 ERROR: not yet debugged!" << std::endl;)

         if((*theCoPvec)[leaveIdx] - theLBbound[leaveIdx] <
               theUBbound[leaveIdx] - (*theCoPvec)[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
         }

         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
#endif
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);
         throw SPxInternalCodeException("XENTER06 This should never happen.");
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax < 0)
            leavebound = theUBbound[leaveIdx];
         else
            leavebound = theLBbound[leaveIdx];

         theLRbound[idx] = leavebound;
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theURbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLRbound[idx] = leavebound;
         objChange += leavebound * this->maxRowObj(leaveIdx);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theURbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLRbound[idx] = leavebound;
            objChange += leavebound * this->maxRowObj(leaveIdx);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER07 This should never happen.");
      }

      SPxOut::debug(this, "DENTER06 SPxSolverBase::getEnterVals2(): row {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(leftId.isSPxColId());
      idx = this->number(SPxColId(leftId));
      typename SPxBasisBase<R>::Desc::Status leaveStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         ds.colStatus(idx) = this->dualColStatus(idx);

         switch(ds.colStatus(idx))
         {
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            objChange += theLCbound[idx] * this->upper(idx);
            break;

         case SPxBasisBase<R>::Desc::D_ON_BOTH :
            objChange += theLCbound[idx] * this->upper(idx);
            objChange += theUCbound[idx] * this->lower(idx);
            break;

         default:
            break;
         }

         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
         }

         ds.colStatus(idx) = SPxBasisBase<R>::Desc::D_UNDEFINED;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED:
         assert(rep() == ROW);
         throw SPxInternalCodeException("XENTER08 This should never happen.");
         break;

      // primal/columnwise cases:
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);

         if(theFvec->delta()[leaveIdx] * enterMax > 0)
            leavebound = theLBbound[leaveIdx];
         else
            leavebound = theUBbound[leaveIdx];

         theUCbound[idx] =
            theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         leavebound = theLBbound[leaveIdx];
         theLCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         leavebound = theUBbound[leaveIdx];
         theUCbound[idx] = leavebound;
         objChange += this->maxObj(idx) * leavebound;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
      case SPxBasisBase<R>::Desc::D_UNDEFINED :
         assert(rep() == COLUMN);

         if(enterMax * theFvec->delta()[leaveIdx] < 0)
         {
            leavebound = theUBbound[leaveIdx];
            theUCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leavebound = theLBbound[leaveIdx];
            theLCbound[idx] = leavebound;
            objChange += this->maxObj(idx) * leavebound;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XENTER09 This should never happen.");
      }

      SPxOut::debug(this, "DENTER07 SPxSolverBase::getEnterVals2(): col {}: {} -> {} objChange: {}\n",
                    idx, leaveStat, ds.colStatus(idx), objChange);
   }
}